

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Converter.cpp
# Opt level: O0

string * __thiscall
UtfConverter::toUtf8_abi_cxx11_
          (string *__return_storage_ptr__,UtfConverter *this,uint8_t *start,size_t numBytes,
          SourceFormat srcFormat)

{
  VodCoreException *this_00;
  code *pcVar1;
  undefined4 in_register_00000084;
  string local_230;
  ostringstream local_210 [8];
  ostringstream ss;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_68;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_50;
  allocator<char> local_25;
  undefined4 local_24;
  uint8_t *puStack_20;
  SourceFormat srcFormat_local;
  size_t numBytes_local;
  uint8_t *start_local;
  
  local_24 = (undefined4)numBytes;
  puStack_20 = start;
  numBytes_local = (size_t)this;
  start_local = (uint8_t *)__return_storage_ptr__;
  switch(local_24) {
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<unsigned_char_const*,void>
              ((string *)__return_storage_ptr__,(uchar *)this,(uchar *)(this + (long)start),
               &local_25);
    std::allocator<char>::~allocator(&local_25);
    break;
  case 2:
    pcVar1 = anon_unknown.dwarf_280dc4::read_le16;
    (anonymous_namespace)::make_vector<unsigned_short(*)(unsigned_char_const*)>
              (&local_68,(_anonymous_namespace_ *)this,start,0x36f260,
               (_func_unsigned_short_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&local_68,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               convertUTF::ConvertUTF16toUTF8,pcVar1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_68);
    break;
  case 3:
    pcVar1 = anon_unknown.dwarf_280dc4::read_be16;
    (anonymous_namespace)::make_vector<unsigned_short(*)(unsigned_char_const*)>
              (&local_50,(_anonymous_namespace_ *)this,start,0x36f240,
               (_func_unsigned_short_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_short,convertUTF::ConversionResult(*)(unsigned_short_const**,unsigned_short_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&local_50,
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
               convertUTF::ConvertUTF16toUTF8,pcVar1);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(&local_50);
    break;
  case 4:
    pcVar1 = anon_unknown.dwarf_280dc4::read_le32;
    (anonymous_namespace)::make_vector<unsigned_int(*)(unsigned_char_const*)>
              (&local_98,(_anonymous_namespace_ *)this,start,0x36f780,
               (_func_uint_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_int,convertUTF::ConversionResult(*)(unsigned_int_const**,unsigned_int_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&local_98,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)convertUTF::ConvertUTF32toUTF8
               ,pcVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_98);
    break;
  case 5:
    pcVar1 = anon_unknown.dwarf_280dc4::read_be32;
    (anonymous_namespace)::make_vector<unsigned_int(*)(unsigned_char_const*)>
              (&local_80,(_anonymous_namespace_ *)this,start,0x36f740,
               (_func_uint_uchar_ptr *)CONCAT44(in_register_00000084,srcFormat));
    (anonymous_namespace)::
    from_utf_nn<unsigned_int,convertUTF::ConversionResult(*)(unsigned_int_const**,unsigned_int_const*,unsigned_char**,unsigned_char_const*,convertUTF::ConversionFlags)>
              (__return_storage_ptr__,(_anonymous_namespace_ *)&local_80,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)convertUTF::ConvertUTF32toUTF8
               ,pcVar1);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
    break;
  default:
    std::__cxx11::ostringstream::ostringstream(local_210);
    std::operator<<((ostream *)local_210,"Unknown parameter to UtfConverter::toUtf8");
    this_00 = (VodCoreException *)__cxa_allocate_exception(0x28);
    std::__cxx11::ostringstream::str();
    VodCoreException::VodCoreException(this_00,3,&local_230);
    __cxa_throw(this_00,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toUtf8(const uint8_t *start, const size_t numBytes, const SourceFormat srcFormat)
{
    switch (srcFormat)
    {
    case SourceFormat::sfUTF8:
        return {start, start + numBytes};
    case SourceFormat::sfUTF16be:
        return from_utf_nn(make_vector(start, numBytes, read_be16), ConvertUTF16toUTF8);
    case SourceFormat::sfUTF16le:
        return from_utf_nn(make_vector(start, numBytes, read_le16), ConvertUTF16toUTF8);
    case SourceFormat::sfUTF32be:
        return from_utf_nn(make_vector(start, numBytes, read_be32), ConvertUTF32toUTF8);
    case SourceFormat::sfUTF32le:
        return from_utf_nn(make_vector(start, numBytes, read_le32), ConvertUTF32toUTF8);
#ifdef _WIN32
    case SourceFormat::sfANSI:
    {
        return ::toUtf8(fromAcp(reinterpret_cast<const char *>(start), static_cast<int>(numBytes)).data());
    }
#endif
    default:
        THROW(ERR_COMMON, "Unknown parameter to UtfConverter::toUtf8")
    }
}